

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb_tests.cpp
# Opt level: O1

void __thiscall
wallet::walletdb_tests::walletdb_readkeyvalue::test_method(walletdb_readkeyvalue *this)

{
  undefined1 **line_num;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  uint256 dummy;
  check_type cVar1;
  char *local_100;
  char *local_f8;
  lazy_ostream local_f0;
  undefined1 *local_e0;
  char *local_d8;
  assertion_result local_d0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  DataStream local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.m_read_pos = 0;
  local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletdb_tests.cpp"
  ;
  local_80 = "";
  line_num = &local_98;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1d;
  file.m_begin = (iterator)&local_88;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)line_num,msg);
  DataStream::read(&local_78,(int)&local_58,(void *)0x20,(size_t)line_num);
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletdb_tests.cpp"
  ;
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1d;
  file_00.m_begin = (iterator)&local_a8;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_b8,msg_00
            );
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3ef0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "exception std::ios_base::failure expected but not raised";
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletdb_tests.cpp"
  ;
  local_f8 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_f0,1,1,WARN,_cVar1,(size_t)&local_100,0x1d);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(walletdb_readkeyvalue)
{
    /**
     * When ReadKeyValue() reads from either a "key" or "wkey" it first reads the DataStream into a
     * CPrivKey or CWalletKey respectively and then reads a hash of the pubkey and privkey into a uint256.
     * Wallets from 0.8 or before do not store the pubkey/privkey hash, trying to read the hash from old
     * wallets throws an exception, for backwards compatibility this read is wrapped in a try block to
     * silently fail. The test here makes sure the type of exception thrown from DataStream::read()
     * matches the type we expect, otherwise we need to update the "key"/"wkey" exception type caught.
     */
    DataStream ssValue{};
    uint256 dummy;
    BOOST_CHECK_THROW(ssValue >> dummy, std::ios_base::failure);
}